

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * __thiscall
QFileDialog::selectedMimeTypeFilter(QString *__return_storage_ptr__,QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  bool bVar3;
  QString *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<QString> local_d8;
  QArrayDataPointer<QString> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<QString> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (((this_00->super_QDialogPrivate).nativeDialogInUse != false) ||
     ((this_00->qFileDialogUi).d == (Ui_QFileDialog *)0x0)) {
    QFileDialogPrivate::selectedMimeTypeFilter_sys((QString *)&local_68,this_00);
    pQVar4 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pDVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_68.ptr;
    local_68.ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = local_68.size;
    local_68.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (pQVar4 != (QString *)0x0) goto LAB_0049c316;
  }
  QFileDialogOptions::mimeTypeFilters();
  qVar2 = local_68.size;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if ((undefined1 *)qVar2 != (undefined1 *)0x0) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedNameFilter((QString *)&local_68,this);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialogOptions::mimeTypeFilters();
    pQVar4 = local_88.ptr;
    for (lVar5 = local_88.size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      nameFilterForMime((QString *)&local_a8,pQVar4);
      bVar3 = testOption(this,HideNameFilterDetails);
      if (bVar3) {
        local_50.d = local_a8.d;
        local_50.ptr = local_a8.ptr;
        local_50.size = local_a8.size;
        if (local_a8.d != (Data *)0x0) {
          LOCK();
          ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        args._M_len = 1;
        args._M_array = (iterator)&local_50;
        QList<QString>::QList((QList<QString> *)&local_d8,args);
        qt_strip_filters((QStringList *)&local_c0,(QStringList *)&local_d8);
        QString::operator=((QString *)&local_a8,(QString *)local_c0.ptr);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
      bVar3 = ::comparesEqual((QString *)&local_a8,(QString *)&local_68);
      if (bVar3) {
        QString::operator=(__return_storage_ptr__,(QString *)pQVar4);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        break;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      pQVar4 = pQVar4 + 1;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
LAB_0049c316:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::selectedMimeTypeFilter() const
{
    Q_D(const QFileDialog);
    QString mimeTypeFilter;
    if (!d->usingWidgets())
        mimeTypeFilter = d->selectedMimeTypeFilter_sys();

#if QT_CONFIG(mimetype)
    if (mimeTypeFilter.isNull() && !d->options->mimeTypeFilters().isEmpty()) {
        const auto nameFilter = selectedNameFilter();
        const auto mimeTypes = d->options->mimeTypeFilters();
        for (const auto &mimeType: mimeTypes) {
            QString filter = nameFilterForMime(mimeType);
            if (testOption(HideNameFilterDetails))
                filter = qt_strip_filters({ filter }).constFirst();
            if (filter == nameFilter) {
                mimeTypeFilter = mimeType;
                break;
            }
        }
    }
#endif

    return mimeTypeFilter;
}